

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O2

int ApprovalTests::FileApprover::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  size_t siglen_00;
  double __x;
  string receivedPath;
  string approvedPath;
  string sStack_e8;
  string local_c8;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  (**(code **)(*(long *)sig + 0x10))(local_48);
  (**(code **)(*(long *)ctx + 0x10))(&local_c8,ctx,local_48);
  ::std::__cxx11::string::~string(local_48);
  (**(code **)(*(long *)sig + 0x10))(local_68,sig);
  (**(code **)(*(long *)ctx + 0x18))(&sStack_e8,ctx,local_68);
  __x = (double)::std::__cxx11::string::~string(local_68);
  ApprovalFileLog::log(__x);
  SystemUtils::ensureParentDirectoryExists(&local_c8);
  SystemUtils::ensureParentDirectoryExists(&sStack_e8);
  ::std::__cxx11::string::string(local_88,(string *)&sStack_e8);
  (**(code **)(*(long *)sig + 0x18))(sig,local_88);
  ::std::__cxx11::string::~string(local_88);
  verify((EVP_PKEY_CTX *)&sStack_e8,(uchar *)&local_c8,siglen_00,tbs,tbslen);
  ::std::__cxx11::string::string(local_a8,(string *)&sStack_e8);
  (**(code **)(*(long *)sig + 0x20))(sig,local_a8);
  ::std::__cxx11::string::~string(local_a8);
  notifyTestPassed();
  ::std::__cxx11::string::~string((string *)&sStack_e8);
  iVar1 = ::std::__cxx11::string::~string((string *)&local_c8);
  return iVar1;
}

Assistant:

void FileApprover::verify(const ApprovalNamer& n,
                              const ApprovalWriter& s,
                              const Reporter& r)
    {
        std::string const approvedPath = n.getApprovedFile(s.getFileExtensionWithDot());
        std::string const receivedPath = n.getReceivedFile(s.getFileExtensionWithDot());

        ApprovalFileLog::log(approvedPath);
        SystemUtils::ensureParentDirectoryExists(approvedPath);
        SystemUtils::ensureParentDirectoryExists(receivedPath);
        s.write(receivedPath);
        try
        {
            verify(receivedPath, approvedPath);
            s.cleanUpReceived(receivedPath);
            notifyTestPassed();
        }
        catch (const ApprovalException&)
        {
            // FailedFileLog::log(receivedPath, approvedPath);
            reportAfterTryingFrontLoadedReporter(receivedPath, approvedPath, r);
            throw;
        }
    }